

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

int json_serialize_to_buffer_r
              (JSON_Value *value,char *buf,int level,parson_bool_t is_pretty,char *num_buf)

{
  JSON_Value_Type JVar1;
  int iVar2;
  uint uVar3;
  size_t len;
  JSON_Object *pJVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  JSON_Value *pJVar8;
  ulong uVar9;
  JSON_Array *pJVar10;
  char *pcVar11;
  double dVar12;
  
  iVar6 = -1;
  JVar1 = -1;
  if (value != (JSON_Value *)0x0) {
    JVar1 = value->type;
  }
  switch(JVar1) {
  case 1:
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"null",4);
    goto LAB_0017258e;
  case 2:
    if ((value == (JSON_Value *)0x0) || (value->type != 2)) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (value->value).string.chars;
    }
    if (pcVar11 != (char *)0x0) {
      if ((value == (JSON_Value *)0x0) || (value->type != 2)) {
        sVar5 = 0;
      }
      else {
        sVar5 = (value->value).string.length;
      }
      iVar6 = json_serialize_string(pcVar11,sVar5,buf);
      if (iVar6 < 0) {
        iVar6 = -1;
      }
    }
    break;
  case 3:
    dVar12 = 0.0;
    if ((value != (JSON_Value *)0x0) && (value->type == 3)) {
      dVar12 = (value->value).number;
    }
    if (buf != (char *)0x0) {
      num_buf = buf;
    }
    if (parson_number_serialization_function == (JSON_Number_Serialization_Function)0x0) {
      pcVar11 = parson_float_format;
      if (parson_float_format == (char *)0x0) {
        pcVar11 = "%1.17g";
      }
      iVar2 = sprintf(num_buf,pcVar11);
    }
    else {
      iVar2 = (*parson_number_serialization_function)(dVar12,num_buf);
    }
    iVar6 = -1;
    if (-1 < iVar2) {
      iVar6 = iVar2;
    }
    break;
  case 4:
    if ((value == (JSON_Value *)0x0) || (value->type != 4)) {
      pJVar4 = (JSON_Object *)0x0;
    }
    else {
      pJVar4 = (value->value).object;
    }
    if (pJVar4 == (JSON_Object *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = pJVar4->count;
    }
    if (buf == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      buf[0] = '{';
      buf[1] = '\0';
      pcVar11 = buf + 1;
    }
    iVar6 = 1;
    if (is_pretty != 0 && sVar5 != 0) {
      iVar6 = 2;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11[0] = '\n';
        pcVar11[1] = '\0';
        pcVar11 = pcVar11 + 1;
      }
    }
    if (sVar5 != 0) {
      uVar9 = 0;
      do {
        if ((pJVar4 == (JSON_Object *)0x0) || (pJVar4->count <= uVar9)) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = pJVar4->names[uVar9];
        }
        if (pcVar7 == (char *)0x0) {
          return -1;
        }
        iVar2 = level + 1;
        if (-1 < level && is_pretty != 0) {
          do {
            if (pcVar11 == (char *)0x0) {
              pcVar11 = (char *)0x0;
            }
            else {
              builtin_strncpy(pcVar11,"    ",5);
              pcVar11 = pcVar11 + 4;
            }
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          iVar6 = iVar6 + level * 4 + 4;
        }
        len = strlen(pcVar7);
        uVar3 = json_serialize_string(pcVar7,len,pcVar11);
        if ((int)uVar3 < 0) {
          return -1;
        }
        if (pcVar11 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar11 = pcVar11 + uVar3;
          pcVar7 = pcVar11 + 1;
          pcVar11[0] = ':';
          pcVar11[1] = '\0';
        }
        if (is_pretty == 0) {
          iVar6 = uVar3 + iVar6 + 1;
        }
        else {
          if (pcVar7 == (char *)0x0) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7[0] = ' ';
            pcVar7[1] = '\0';
            pcVar7 = pcVar7 + 1;
          }
          iVar6 = uVar3 + iVar6 + 2;
        }
        if ((pJVar4 == (JSON_Object *)0x0) || (pJVar4->count <= uVar9)) {
          pJVar8 = (JSON_Value *)0x0;
        }
        else {
          pJVar8 = pJVar4->values[uVar9];
        }
        uVar3 = json_serialize_to_buffer_r(pJVar8,pcVar7,level + 1,is_pretty,num_buf);
        if ((int)uVar3 < 0) {
          return -1;
        }
        pcVar11 = pcVar7 + uVar3;
        if (pcVar7 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        iVar6 = iVar6 + uVar3;
        if (uVar9 < sVar5 - 1) {
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11[0] = ',';
            pcVar11[1] = '\0';
            pcVar11 = pcVar11 + 1;
          }
          iVar6 = iVar6 + 1;
        }
        if (is_pretty != 0) {
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11[0] = '\n';
            pcVar11[1] = '\0';
            pcVar11 = pcVar11 + 1;
          }
          iVar6 = iVar6 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != sVar5);
    }
    if ((is_pretty != 0 && sVar5 != 0) && 0 < level) {
      iVar2 = level * 4;
      do {
        if (pcVar11 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar11,"    ",5);
          pcVar11 = pcVar11 + 4;
        }
        level = level + -1;
      } while (level != 0);
      iVar6 = iVar6 + iVar2;
    }
    if (pcVar11 != (char *)0x0) {
      pcVar11[0] = '}';
      pcVar11[1] = '\0';
    }
    iVar6 = iVar6 + 1;
    break;
  case 5:
    if ((value == (JSON_Value *)0x0) || (value->type != 5)) {
      pJVar10 = (JSON_Array *)0x0;
    }
    else {
      pJVar10 = (value->value).array;
    }
    if (pJVar10 == (JSON_Array *)0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = pJVar10->count;
    }
    if (buf == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      buf[0] = '[';
      buf[1] = '\0';
      pcVar11 = buf + 1;
    }
    iVar6 = 1;
    if (is_pretty != 0 && sVar5 != 0) {
      iVar6 = 2;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11[0] = '\n';
        pcVar11[1] = '\0';
        pcVar11 = pcVar11 + 1;
      }
    }
    if (sVar5 != 0) {
      uVar9 = 0;
      do {
        pcVar7 = pcVar11;
        iVar2 = level + 1;
        if (-1 < level && is_pretty != 0) {
          do {
            if (pcVar11 == (char *)0x0) {
              pcVar11 = (char *)0x0;
            }
            else {
              builtin_strncpy(pcVar11,"    ",5);
              pcVar11 = pcVar11 + 4;
            }
            iVar2 = iVar2 + -1;
          } while (iVar2 != 0);
          iVar6 = iVar6 + level * 4 + 4;
          pcVar7 = pcVar11;
        }
        if ((pJVar10 == (JSON_Array *)0x0) || (pJVar10->count <= uVar9)) {
          pJVar8 = (JSON_Value *)0x0;
        }
        else {
          pJVar8 = pJVar10->items[uVar9];
        }
        uVar3 = json_serialize_to_buffer_r(pJVar8,pcVar7,level + 1,is_pretty,num_buf);
        if ((int)uVar3 < 0) {
          return -1;
        }
        pcVar11 = pcVar7 + uVar3;
        if (pcVar7 == (char *)0x0) {
          pcVar11 = pcVar7;
        }
        iVar6 = iVar6 + uVar3;
        if (uVar9 < sVar5 - 1) {
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11[0] = ',';
            pcVar11[1] = '\0';
            pcVar11 = pcVar11 + 1;
          }
          iVar6 = iVar6 + 1;
        }
        if (is_pretty != 0) {
          if (pcVar11 == (char *)0x0) {
            pcVar11 = (char *)0x0;
          }
          else {
            pcVar11[0] = '\n';
            pcVar11[1] = '\0';
            pcVar11 = pcVar11 + 1;
          }
          iVar6 = iVar6 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != sVar5);
    }
    if ((is_pretty != 0 && sVar5 != 0) && 0 < level) {
      iVar2 = level * 4;
      do {
        if (pcVar11 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          builtin_strncpy(pcVar11,"    ",5);
          pcVar11 = pcVar11 + 4;
        }
        level = level + -1;
      } while (level != 0);
      iVar6 = iVar6 + iVar2;
    }
    if (pcVar11 != (char *)0x0) {
      pcVar11[0] = ']';
      pcVar11[1] = '\0';
    }
    iVar6 = iVar6 + 1;
    break;
  case 6:
    if (((value != (JSON_Value *)0x0) && (value->type == 6)) && ((value->value).boolean == 0)) {
      if (buf != (char *)0x0) {
        builtin_strncpy(buf,"false",6);
        return 5;
      }
      return 5;
    }
    if (buf == (char *)0x0) {
      return 4;
    }
    builtin_strncpy(buf,"true",4);
LAB_0017258e:
    iVar6 = 4;
    buf[4] = '\0';
  }
  return iVar6;
}

Assistant:

static int json_serialize_to_buffer_r(const JSON_Value *value, char *buf, int level, parson_bool_t is_pretty, char *num_buf)
{
    const char *key = NULL, *string = NULL;
    JSON_Value *temp_value = NULL;
    JSON_Array *array = NULL;
    JSON_Object *object = NULL;
    size_t i = 0, count = 0;
    double num = 0.0;
    int written = -1, written_total = 0;
    size_t len = 0;

    switch (json_value_get_type(value)) {
        case JSONArray:
            array = json_value_get_array(value);
            count = json_array_get_count(array);
            APPEND_STRING("[");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                temp_value = json_array_get_value(array, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("]");
            return written_total;
        case JSONObject:
            object = json_value_get_object(value);
            count  = json_object_get_count(object);
            APPEND_STRING("{");
            if (count > 0 && is_pretty) {
                APPEND_STRING("\n");
            }
            for (i = 0; i < count; i++) {
                key = json_object_get_name(object, i);
                if (key == NULL) {
                    return -1;
                }
                if (is_pretty) {
                    APPEND_INDENT(level+1);
                }
                /* We do not support key names with embedded \0 chars */
                written = json_serialize_string(key, strlen(key), buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                APPEND_STRING(":");
                if (is_pretty) {
                    APPEND_STRING(" ");
                }
                temp_value = json_object_get_value_at(object, i);
                written = json_serialize_to_buffer_r(temp_value, buf, level+1, is_pretty, num_buf);
                if (written < 0) {
                    return -1;
                }
                if (buf != NULL) {
                    buf += written;
                }
                written_total += written;
                if (i < (count - 1)) {
                    APPEND_STRING(",");
                }
                if (is_pretty) {
                    APPEND_STRING("\n");
                }
            }
            if (count > 0 && is_pretty) {
                APPEND_INDENT(level);
            }
            APPEND_STRING("}");
            return written_total;
        case JSONString:
            string = json_value_get_string(value);
            if (string == NULL) {
                return -1;
            }
            len = json_value_get_string_len(value);
            written = json_serialize_string(string, len, buf);
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONBoolean:
            if (json_value_get_boolean(value)) {
                APPEND_STRING("true");
            } else {
                APPEND_STRING("false");
            }
            return written_total;
        case JSONNumber:
            num = json_value_get_number(value);
            if (buf != NULL) {
                num_buf = buf;
            }
            if (parson_number_serialization_function) {
                written = parson_number_serialization_function(num, num_buf);
            } else if (parson_float_format) {
                written = sprintf(num_buf, parson_float_format, num);
            } else {
                written = sprintf(num_buf, PARSON_DEFAULT_FLOAT_FORMAT, num);
            }
            if (written < 0) {
                return -1;
            }
            if (buf != NULL) {
                buf += written;
            }
            written_total += written;
            return written_total;
        case JSONNull:
            APPEND_STRING("null");
            return written_total;
        case JSONError:
            return -1;
        default:
            return -1;
    }
}